

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCube.c
# Opt level: O3

Mvc_Cube_t * Mvc_CubeAlloc(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  uint uVar2;
  Extra_MmFixed_t *p;
  
  uVar2 = pCover->nWords;
  if ((int)uVar2 < 0) {
    __assert_fail("pCover->nWords >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcCube.c"
                  ,0x2f,"Mvc_Cube_t *Mvc_CubeAlloc(Mvc_Cover_t *)");
  }
  if (uVar2 < 2) {
    p = pCover->pMem->pMan1;
  }
  else if (uVar2 - 3 < 2) {
    p = pCover->pMem->pMan4;
  }
  else {
    if (uVar2 != 2) {
      pMVar1 = (Mvc_Cube_t *)malloc((ulong)(uVar2 - 1) * 4 + 0x18);
      goto LAB_00422b91;
    }
    p = pCover->pMem->pMan2;
  }
  pMVar1 = (Mvc_Cube_t *)Extra_MmFixedEntryFetch(p);
LAB_00422b91:
  if (pCover->nWords == 0) {
    uVar2 = (uint)(byte)pMVar1->field_0xb << 0x18;
  }
  else {
    uVar2 = pCover->nWords - 1U & 0xffffff | (uint)(byte)pMVar1->field_0xb << 0x18;
  }
  *(uint *)&pMVar1->field_0x8 = uVar2;
  *(uint *)&pMVar1->field_0x8 = uVar2 & 0xc0ffffff | (pCover->nUnused & 0x3fU) << 0x18;
  return pMVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Cube_t * Mvc_CubeAlloc( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;

    assert( pCover->nWords >= 0 );
    // allocate the cube
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    if ( pCover->nWords == 0 )
        pCube = (Mvc_Cube_t *)ABC_ALLOC( char, sizeof(Mvc_Cube_t) );
    else
        pCube = (Mvc_Cube_t *)ABC_ALLOC( char,  sizeof(Mvc_Cube_t) + sizeof(Mvc_CubeWord_t) * (pCover->nWords - 1) );
#else
    switch( pCover->nWords )
    {
    case 0:
    case 1:
        pCube = (Mvc_Cube_t *)Extra_MmFixedEntryFetch( pCover->pMem->pMan1 );
        break;
    case 2:
        pCube = (Mvc_Cube_t *)Extra_MmFixedEntryFetch( pCover->pMem->pMan2 );
        break;
    case 3:
    case 4:
        pCube = (Mvc_Cube_t *)Extra_MmFixedEntryFetch( pCover->pMem->pMan4 );
        break;
    default:
        pCube = (Mvc_Cube_t *)ABC_ALLOC( char, sizeof(Mvc_Cube_t) + sizeof(Mvc_CubeWord_t) * (pCover->nWords - 1) );
        break;
    }
#endif
    // set the parameters charactering this cube
    if ( pCover->nWords == 0 )
        pCube->iLast   = pCover->nWords;
    else
        pCube->iLast   = pCover->nWords - 1;
    pCube->nUnused = pCover->nUnused;
    return pCube;
}